

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaClearAttrInfos(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaAttrInfoPtr __s;
  xmlSchemaAttrInfoPtr attr;
  int i;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if (vctxt->nbAttrInfos != 0) {
    for (attr._4_4_ = 0; attr._4_4_ < vctxt->nbAttrInfos; attr._4_4_ = attr._4_4_ + 1) {
      __s = vctxt->attrInfos[attr._4_4_];
      if ((__s->flags & 1U) != 0) {
        if (__s->localName != (xmlChar *)0x0) {
          (*xmlFree)(__s->localName);
        }
        if (__s->nsName != (xmlChar *)0x0) {
          (*xmlFree)(__s->nsName);
        }
      }
      if (((__s->flags & 2U) != 0) && (__s->value != (xmlChar *)0x0)) {
        (*xmlFree)(__s->value);
      }
      if (__s->val != (xmlSchemaValPtr)0x0) {
        xmlSchemaFreeValue(__s->val);
        __s->val = (xmlSchemaValPtr)0x0;
      }
      memset(__s,0,0x70);
    }
    vctxt->nbAttrInfos = 0;
  }
  return;
}

Assistant:

static void
xmlSchemaClearAttrInfos(xmlSchemaValidCtxtPtr vctxt)
{
    int i;
    xmlSchemaAttrInfoPtr attr;

    if (vctxt->nbAttrInfos == 0)
	return;
    for (i = 0; i < vctxt->nbAttrInfos; i++) {
	attr = vctxt->attrInfos[i];
	if (attr->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_NAMES) {
	    if (attr->localName != NULL)
		xmlFree((xmlChar *) attr->localName);
	    if (attr->nsName != NULL)
		xmlFree((xmlChar *) attr->nsName);
	}
	if (attr->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	    if (attr->value != NULL)
		xmlFree((xmlChar *) attr->value);
	}
	if (attr->val != NULL) {
	    xmlSchemaFreeValue(attr->val);
	    attr->val = NULL;
	}
	memset(attr, 0, sizeof(xmlSchemaAttrInfo));
    }
    vctxt->nbAttrInfos = 0;
}